

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanU8 ZydisGetCompDispScale(ZydisEncoderInstructionMatch *match)

{
  ushort uVar1;
  ZydisEncoderInstructionMatch *match_local;
  
  uVar1 = *(ushort *)&match->definition->field_0x6 & 7;
  if ((byte)uVar1 < 4) {
    match_local._7_1_ = '\0';
  }
  else if (uVar1 == 4) {
    match_local._7_1_ = ZydisGetCompDispScaleEvex(match);
  }
  else {
    if (uVar1 != 5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Encoder.c"
                    ,0x4cd,"ZyanU8 ZydisGetCompDispScale(const ZydisEncoderInstructionMatch *)");
    }
    match_local._7_1_ = ZydisGetCompDispScaleMvex(match);
  }
  return match_local._7_1_;
}

Assistant:

static ZyanU8 ZydisGetCompDispScale(const ZydisEncoderInstructionMatch *match)
{
    switch (match->definition->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
        return 0;
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        return ZydisGetCompDispScaleEvex(match);
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
        return ZydisGetCompDispScaleMvex(match);
    default:
        ZYAN_UNREACHABLE;
    }
}